

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::declareBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *typeList,TString *instanceName,
          TArraySizes *arraySizes)

{
  TQualifier *qualifier;
  TVector<glslang::TArraySize> *pTVar1;
  TSymbolTable *pTVar2;
  TArraySizes *pTVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  pointer pTVar10;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar11;
  pointer pTVar12;
  TPoolAllocator *pTVar13;
  TVariable *pTVar14;
  TSymbol *pTVar15;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  long *plVar16;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TType *pTVar17;
  byte bVar18;
  ulong uVar19;
  long lVar20;
  TString *identifier;
  pointer pcVar21;
  uint uVar22;
  char *pcVar23;
  undefined8 *puVar24;
  TParseContext *pTVar25;
  char *pcVar26;
  _func_int **pp_Var27;
  TSourceLoc *pTVar28;
  uint uVar29;
  byte bVar30;
  TType blockType;
  TType blockNameType;
  bool local_1e0;
  bool local_1d8;
  undefined1 local_1c8 [28];
  _Base_ptr local_1ac;
  _Base_ptr local_1a4;
  undefined1 local_19c;
  undefined4 local_19b;
  int local_194;
  undefined4 local_190;
  int local_18c;
  _Node_allocator local_188;
  undefined2 local_180;
  _Base_ptr local_170;
  _Base_ptr local_168;
  TType local_160;
  TType local_c8;
  TQualifier *pTVar8;
  
  bVar30 = 0;
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == true)) {
    blockStorageRemap(this,loc,this->blockName,&this->currentBlockQualifier);
  }
  qualifier = &this->currentBlockQualifier;
  blockStageIoCheck(this,loc,qualifier);
  blockQualifierCheck(this,loc,qualifier,false);
  if (arraySizes != (TArraySizes *)0x0) {
    arraySizesCheck(this,loc,qualifier,arraySizes,(TIntermTyped *)0x0,false);
    arrayOfArrayVersionCheck(this,loc,arraySizes);
    pTVar1 = (arraySizes->sizes).sizes;
    if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
       (1 < (int)((ulong)((long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"array-of-array of block");
    }
  }
  pTVar10 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
            .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar10) {
    uVar29 = 1;
    uVar11 = 0;
    do {
      pTVar17 = pTVar10[uVar11].type;
      iVar6 = (*pTVar17->_vptr_TType[10])(pTVar17);
      pTVar8 = (TQualifier *)CONCAT44(extraout_var,iVar6);
      pTVar28 = &(typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11].loc;
      uVar9 = *(ulong *)&pTVar8->field_0x8;
      uVar22 = (uint)uVar9 & 0x7f;
      uVar7 = (uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8;
      if (uVar22 != (uVar7 & 0x7f) && 1 < uVar22) {
        iVar6 = (*pTVar17->_vptr_TType[6])(pTVar17);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member storage qualifier cannot contradict block storage qualifier"
                   ,*(undefined8 *)(CONCAT44(extraout_var_00,iVar6) + 8));
        uVar7 = (uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8;
        uVar9 = *(ulong *)&pTVar8->field_0x8;
      }
      *(ulong *)&pTVar8->field_0x8 = uVar9 & 0xffffffffffffff80 | (ulong)(uVar7 & 0x7f);
      pTVar25 = this;
      globalQualifierFixCheck(this,pTVar28,pTVar8,false,(TPublicType *)0x0);
      inheritMemoryQualifiers(pTVar25,qualifier,pTVar8);
      uVar19 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
      uVar9 = *(ulong *)&pTVar8->field_0x8;
      if ((uVar19 & 0x20000000000) != 0) {
        uVar9 = uVar9 | 0x20000000000;
        *(ulong *)&pTVar8->field_0x8 = uVar9;
        uVar19 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
      }
      if ((uVar19 & 0x40000000000) != 0) {
        uVar9 = uVar9 | 0x40000000000;
        *(ulong *)&pTVar8->field_0x8 = uVar9;
        uVar19 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
      }
      if ((uVar19 & 0x80000000000) != 0) {
        uVar9 = uVar9 | 0x80000000000;
        *(ulong *)&pTVar8->field_0x8 = uVar9;
        uVar19 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
      }
      if (((uint)uVar19 & 0x7f) == 0xf) {
        uVar9 = uVar9 & 0xffffffffffffff80 | 0xf;
        *(ulong *)&pTVar8->field_0x8 = uVar9;
      }
      if (((uint)uVar9 & 0x7f) == 8) {
        iVar6 = (*pTVar17->_vptr_TType[6])(pTVar17);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member cannot have a spirv_storage_class qualifier",
                   *(undefined8 *)(CONCAT44(extraout_var_01,iVar6) + 8));
      }
      if ((pTVar8->spirvDecorate != (TSpirvDecorate *)0x0) &&
         ((pTVar8->spirvDecorate->decorateIds).
          super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        iVar6 = (*pTVar17->_vptr_TType[6])(pTVar17);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member cannot have a spirv_decorate_id qualifier",
                   *(undefined8 *)(CONCAT44(extraout_var_02,iVar6) + 8));
      }
      if (((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) - 5 < 2) &&
         ((*(uint *)&pTVar8->field_0xa & 0x31e0e000) != 0)) {
        iVar6 = (*pTVar17->_vptr_TType[6])(pTVar17);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,
                   "member of uniform or buffer block cannot have an auxiliary or interpolation qualifier"
                   ,*(undefined8 *)(CONCAT44(extraout_var_03,iVar6) + 8));
      }
      iVar6 = (*pTVar17->_vptr_TType[0x1d])(pTVar17);
      if ((char)iVar6 != '\0') {
        iVar6 = (*pTVar17->_vptr_TType[0x14])(pTVar17);
        arraySizesCheck(this,pTVar28,qualifier,(TArraySizes *)CONCAT44(extraout_var_04,iVar6),
                        (TIntermTyped *)0x0,
                        ((long)(typeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(typeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar11);
      }
      if ((pTVar8->layoutOffset != -1) &&
         ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0)) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar28,-9,0x1b8,"GL_ARB_enhanced_layouts",
                   "\"offset\" on block member");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar28,8,300,"GL_ARB_enhanced_layouts",
                   "\"offset\" on block member");
      }
      iVar6 = (*pTVar17->_vptr_TType[0x36])(pTVar17);
      if ((char)iVar6 != '\0') {
        iVar6 = (*pTVar17->_vptr_TType[0x37])(pTVar17);
        if (((char)iVar6 == '\0') ||
           (iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                              (this,"GL_ARB_bindless_texture"), (char)iVar6 == '\0')) {
          iVar6 = (*((typeList->
                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,pTVar28,
                     "member of block cannot be or contain a sampler, image, or atomic_uint type",
                     *(undefined8 *)(CONCAT44(extraout_var_05,iVar6) + 8));
        }
        else {
          updateBindlessQualifier(this,pTVar17);
        }
      }
      bVar4 = TType::
              contains<glslang::TType::containsCoopMat()const::_lambda(glslang::TType_const*)_1_>
                        (pTVar17);
      if (bVar4) {
        iVar6 = (*((typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member of block cannot be or contain a cooperative matrix type",
                   *(undefined8 *)(CONCAT44(extraout_var_06,iVar6) + 8));
      }
      bVar4 = TType::
              contains<glslang::TType::containsCoopVec()const::_lambda(glslang::TType_const*)_1_>
                        (pTVar17);
      if (bVar4) {
        iVar6 = (*((typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member of block cannot be or contain a cooperative vector type",
                   *(undefined8 *)(CONCAT44(extraout_var_07,iVar6) + 8));
      }
      uVar11 = (ulong)uVar29;
      pTVar10 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar29 = uVar29 + 1;
    } while (uVar11 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 5)
            );
  }
  pTVar2 = (this->super_TParseContextBase).symbolTable;
  if ((3 < (int)((ulong)((long)(pTVar2->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar2->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     (iVar6 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (this->blockName,0,3,"gl_"), iVar6 == 0)) {
    redeclareBuiltinBlock(this,loc,typeList,this->blockName,instanceName,arraySizes);
    return;
  }
  pTVar25 = this;
  reservedErrorCheck(this,loc,this->blockName);
  if (instanceName != (TString *)0x0) {
    pTVar25 = this;
    reservedErrorCheck(this,loc,instanceName);
  }
  pTVar10 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
            .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar10) {
    uVar11 = 0;
    uVar9 = 1;
    do {
      iVar6 = (*(pTVar10[uVar11].type)->_vptr_TType[6])();
      pTVar25 = this;
      reservedErrorCheck(this,&pTVar10[uVar11].loc,(TString *)CONCAT44(extraout_var_08,iVar6));
      pTVar10 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar9 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 5)
      ;
      uVar11 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  uVar11 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
  switch((uint)uVar11 & 0x7f) {
  case 3:
    pTVar8 = &this->globalInputDefaults;
    break;
  case 4:
    pTVar8 = &this->globalOutputDefaults;
    break;
  case 5:
    pTVar8 = &this->globalUniformDefaults;
    break;
  case 6:
    pTVar8 = &this->globalBufferDefaults;
    break;
  case 7:
    pTVar8 = &this->globalSharedDefaults;
    break;
  default:
    local_1c8._0_8_ = (_func_int **)0x0;
    local_1c8[8] = false;
    local_1c8._9_3_ = 0;
    local_1c8._12_4_ = EBadProfile;
    local_1c8[0x10] = 0;
    local_1c8._20_4_ = -1;
    local_1c8._24_4_ = -1;
    local_19b = 0;
    local_194 = -0x800;
    local_180 = 0;
    local_190._0_1_ = false;
    local_190._1_1_ = false;
    local_190._2_1_ = false;
    local_190._3_1_ = false;
    local_19c = 0;
    local_1ac = (_Base_ptr)0xffffffff001fcfff;
    local_1a4 = (_Base_ptr)0xffffffffffffffff;
    local_18c = -1;
    local_188.allocator = (TPoolAllocator *)0x0;
    goto LAB_004bbd11;
  }
  pTVar25 = (TParseContext *)local_1c8;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pTVar25->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions =
         (_func_int **)pTVar8->semanticName;
    pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar30 * -0x10 + 8);
    pTVar25 = (TParseContext *)((long)pTVar25 + (ulong)bVar30 * -0x10 + 8);
  }
LAB_004bbd11:
  if ((((this->currentBlockQualifier).layoutPushConstant == true) &&
      (bVar18 = (this->currentBlockQualifier).field_0x10, (bVar18 & 0xf) == 0)) ||
     (((this->currentBlockQualifier).layoutShaderRecord == true &&
      (bVar18 = (this->currentBlockQualifier).field_0x10, (bVar18 & 0xf) == 0)))) {
    (this->currentBlockQualifier).field_0x10 = bVar18 & 0xf0 | 3;
  }
  if (((uVar11 & 0x80000000000) != 0) &&
     (bVar18 = (this->currentBlockQualifier).field_0x10, (bVar18 & 0xf) == 0)) {
    (this->currentBlockQualifier).field_0x10 = bVar18 | 3;
  }
  mergeObjectLayoutQualifiers(pTVar25,(TQualifier *)local_1c8,qualifier,true);
  if (((this->currentBlockQualifier).layoutAlign != -1) &&
     ((5 < (local_1c8[0x10] & 0xf) || ((0x2cU >> (local_1c8[0x10] & 0xf) & 1) == 0)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be used with std140, std430, or scalar layout packing","align");
    local_1c8._24_4_ = -1;
  }
  pTVar10 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
            .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish == pTVar10) {
    bVar18 = 0;
    local_1d8 = false;
    local_1e0 = false;
  }
  else {
    local_168 = local_1ac;
    local_170 = local_1a4;
    uVar29 = (uint)local_1c8[0x10];
    local_1e0 = false;
    local_1d8 = false;
    bVar18 = 0;
    uVar11 = 0;
    uVar9 = 1;
    do {
      iVar6 = (*(pTVar10[uVar11].type)->_vptr_TType[10])();
      pTVar8 = (TQualifier *)CONCAT44(extraout_var_09,iVar6);
      pTVar28 = &(typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11].loc;
      if (((char)(*(ulong *)&pTVar8->field_0x1c >> 0x38) != -1) &&
         ((*(ulong *)&pTVar8->field_0x1c ^ (ulong)local_168) >> 0x38 != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member cannot contradict block","stream");
      }
      uVar7 = (uint)*(undefined8 *)&pTVar8->field_0x24;
      if (((~uVar7 & 0xf) != 0) && (((uVar7 ^ (uint)local_170) & 0xf) != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,
                   "member cannot contradict block (or what block inherited from global)",
                   "xfb_buffer");
      }
      if ((pTVar8->field_0x10 & 0xf) != 0) {
        iVar6 = (*((typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"member of block cannot have a packing layout qualifier",
                   *(undefined8 *)(CONCAT44(extraout_var_10,iVar6) + 8));
      }
      if ((~*(uint *)&pTVar8->field_0x1c & 0xfff) == 0) {
        local_1d8 = true;
      }
      else if ((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) - 3 < 2) {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,pTVar28,0xe,"location on block member");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar28,6,0x1b8,"GL_ARB_enhanced_layouts",
                   "location on block member");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar28,8,0x140,2,(char **)AEP_shader_io_blocks,
                   "location on block member");
        local_1e0 = true;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"can only use in an in/out block","location on block member");
      }
      if (((pTVar8->layoutAlign != -1) || (pTVar8->layoutOffset != -1)) &&
         ((5 < (uVar29 & 0xf) || ((0x2cU >> (uVar29 & 0xf) & 1) == 0)))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar28,"can only be used with std140, std430, or scalar layout packing",
                   "offset/align");
      }
      bVar18 = bVar18 | (*(ulong *)&pTVar8->field_0x8 & 0x40000000000) != 0;
      puVar24 = (undefined8 *)local_1c8;
      pTVar17 = &local_160;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        pTVar17->_vptr_TType = (_func_int **)*puVar24;
        puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
        pTVar17 = (TType *)((long)pTVar17 + (ulong)bVar30 * -0x10 + 8);
      }
      mergeQualifiers(this,pTVar28,(TQualifier *)&local_160,pTVar8,false);
      pTVar17 = &local_160;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        pTVar8->semanticName = (char *)pTVar17->_vptr_TType;
        pTVar17 = (TType *)((long)pTVar17 + (ulong)bVar30 * -0x10 + 8);
        pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar30 * -0x10 + 8);
      }
      pTVar10 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar9 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10 >> 5)
      ;
      uVar11 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  layoutMemberLocationArrayCheck(this,loc,local_1e0,arraySizes);
  if ((((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
      (uVar11 = (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf),
      uVar11 != 0xf)) &&
     (uVar9 = *(ulong *)&(this->currentBlockQualifier).field_0x24, uVar29 = ~(uint)uVar9,
     (uVar29 & 0x7ffc0000) != 0 && (uVar29 & 0xf) == 0)) {
    *(ulong *)&(this->currentBlockQualifier).field_0x24 = uVar9 & 0xfffffffffffffff0 | uVar11;
  }
  fixBlockLocations(this,loc,qualifier,typeList,local_1e0,local_1d8);
  fixXfbOffsets(this,qualifier,typeList);
  fixBlockUniformOffsets(this,qualifier,typeList);
  fixBlockUniformLayoutMatrix(this,qualifier,typeList,(TTypeList *)0x0);
  pTVar25 = this;
  fixBlockUniformLayoutPacking(this,qualifier,typeList,(TTypeList *)0x0);
  pTVar12 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
            .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar10 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
            .super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar10 != pTVar12) {
    uVar11 = 0;
    uVar9 = 1;
    do {
      pTVar25 = this;
      layoutTypeCheck(this,&pTVar12[uVar11].loc,pTVar12[uVar11].type);
      pTVar12 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar10 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      bVar4 = uVar9 < (ulong)((long)pTVar10 - (long)pTVar12 >> 5);
      uVar11 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  if (!(bool)(~bVar18 & 1 | pTVar10 == pTVar12)) {
    uVar11 = 0;
    uVar9 = 1;
    do {
      pTVar25 = this;
      checkAndResizeMeshViewDim(this,&pTVar12[uVar11].loc,pTVar12[uVar11].type,true);
      pTVar12 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar9 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5)
      ;
      uVar11 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  mergeObjectLayoutQualifiers(pTVar25,qualifier,(TQualifier *)local_1c8,true);
  TType::TType(&local_160,typeList,this->blockName,qualifier);
  pTVar3 = arraySizes;
  if (arraySizes == (TArraySizes *)0x0) {
    identifier = instanceName;
    if (instanceName == (TString *)0x0) {
      identifier = this->blockName;
    }
    ioArrayCheck(this,loc,&local_160,identifier);
    pTVar3 = local_160.arraySizes;
  }
  local_160.arraySizes = pTVar3;
  if ((this->currentBlockQualifier).layoutBufferReference == true) {
    if ((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) != 6) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only be used with buffer","buffer_reference","");
    }
    TType::TType(&local_c8,EbtReference,&local_160,this->blockName);
    pTVar13 = GetThreadPoolAllocator();
    pTVar14 = (TVariable *)TPoolAllocator::allocate(pTVar13,0xf8);
    TVariable::TVariable(pTVar14,this->blockName,this->blockName,&local_c8,true);
    bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar14);
    if (!bVar4) {
      pTVar15 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,this->blockName,
                                   (bool *)0x0,(bool *)0x0,(int *)0x0);
      iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
      iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x38))
                        ((long *)CONCAT44(extraout_var_11,iVar6));
      if (iVar6 == 0x12) {
        iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
        plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0xa8))
                                    ((long *)CONCAT44(extraout_var_12,iVar6));
        cVar5 = (**(code **)(*plVar16 + 0x128))(plVar16);
        if (cVar5 == '\0') {
LAB_004bc78e:
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        if (plVar16[0xd] != 0) {
          iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
          plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_13,iVar6) + 0xa8))
                                      ((long *)CONCAT44(extraout_var_13,iVar6));
          cVar5 = (**(code **)(*plVar16 + 0x128))(plVar16);
          if (cVar5 == '\0') goto LAB_004bc78e;
          if (*(long *)(plVar16[0xd] + 0x10) == *(long *)(plVar16[0xd] + 8)) {
            iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
            lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x58))
                               ((long *)CONCAT44(extraout_var_14,iVar6));
            if (((local_160.qualifier._8_4_ ^ *(TStorageQualifier *)(lVar20 + 8)) & 0x7f) ==
                EvqTemporary) {
              iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
              pTVar17 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 0xa8))
                                           ((long *)CONCAT44(extraout_var_19,iVar6));
              TType::deepCopy(pTVar17,&local_160);
              goto LAB_004bc457;
            }
          }
        }
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"block name cannot be redefined",(this->blockName->_M_dataplus)._M_p);
    }
LAB_004bc457:
    if (instanceName == (TString *)0x0) {
      return;
    }
LAB_004bc579:
    pTVar13 = GetThreadPoolAllocator();
    pTVar14 = (TVariable *)TPoolAllocator::allocate(pTVar13,0xf8);
    TVariable::TVariable(pTVar14,instanceName,instanceName,&local_160,false);
    bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar14);
    if (bVar4) {
      layoutObjectCheck(this,loc,(TSymbol *)pTVar14);
      bVar4 = isIoResizeArray(this,&local_160);
      if (bVar4) {
        local_c8._vptr_TType = (_func_int **)pTVar14;
        std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>::
        emplace_back<glslang::TSymbol*>
                  ((vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>> *)
                   &this->ioArraySymbolResizeList,(TSymbol **)&local_c8);
        checkIoArraysConsistency(this,loc,true);
      }
      else {
        iVar6 = (*(pTVar14->super_TSymbol)._vptr_TSymbol[0xd])(pTVar14);
        fixIoArraySize(this,loc,(TType *)CONCAT44(extraout_var_18,iVar6));
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,pTVar14);
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(instanceName,"");
    if (iVar6 == 0) {
      pcVar21 = (this->blockName->_M_dataplus)._M_p;
      pp_Var27 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar23 = "nameless block contains a member that already has a name at global scope";
    }
    else {
      iVar6 = (*(pTVar14->super_TSymbol)._vptr_TSymbol[3])(pTVar14);
      pcVar21 = *(pointer *)(CONCAT44(extraout_var_17,iVar6) + 8);
      pp_Var27 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar23 = "block instance name redefinition";
    }
  }
  else {
    TType::TType(&local_c8,EbtBlock,local_160.qualifier._8_4_ & 0x7f,1,0,0,false);
    pTVar13 = GetThreadPoolAllocator();
    pTVar14 = (TVariable *)TPoolAllocator::allocate(pTVar13,0xf8);
    TVariable::TVariable(pTVar14,this->blockName,this->blockName,&local_c8,false);
    bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar14);
    if (bVar4) {
LAB_004bc53c:
      if (instanceName == (TString *)0x0) {
        pTVar13 = GetThreadPoolAllocator();
        instanceName = (TString *)TPoolAllocator::allocate(pTVar13,0x28);
        pTVar13 = GetThreadPoolAllocator();
        (instanceName->_M_dataplus).super_allocator_type.allocator = pTVar13;
        (instanceName->_M_dataplus)._M_p = (pointer)&instanceName->field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   instanceName,"");
      }
      goto LAB_004bc579;
    }
    pTVar15 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,this->blockName,
                                 (bool *)0x0,(bool *)0x0,(int *)0x0);
    iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_15,iVar6));
    if (iVar6 == 0x10) {
      iVar6 = (*pTVar15->_vptr_TSymbol[0xc])(pTVar15);
      lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_16,iVar6));
      if (((local_160.qualifier._8_4_ ^ *(TStorageQualifier *)(lVar20 + 8)) & 0x7f) == EvqTemporary)
      {
        pcVar21 = (this->blockName->_M_dataplus)._M_p;
        pcVar26 = TType::getStorageQualifierString(&local_160);
        pp_Var27 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar23 = "Cannot reuse block name within the same interface:";
        goto LAB_004bc717;
      }
      goto LAB_004bc53c;
    }
    pcVar21 = (this->blockName->_M_dataplus)._M_p;
    pp_Var27 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar23 = "block name cannot redefine a non-block name";
  }
  pcVar26 = "";
LAB_004bc717:
  (*pp_Var27[0x2d])(this,loc,pcVar23,pcVar21,pcVar26);
  return;
}

Assistant:

void TParseContext::declareBlock(const TSourceLoc& loc, TTypeList& typeList, const TString* instanceName,
    TArraySizes* arraySizes)
{
    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed)
        blockStorageRemap(loc, blockName, currentBlockQualifier);
    blockStageIoCheck(loc, currentBlockQualifier);
    blockQualifierCheck(loc, currentBlockQualifier, instanceName != nullptr);
    if (arraySizes != nullptr) {
        arraySizesCheck(loc, currentBlockQualifier, arraySizes, nullptr, false);
        arrayOfArrayVersionCheck(loc, arraySizes);
        if (arraySizes->getNumDims() > 1)
            requireProfile(loc, ~EEsProfile, "array-of-array of block");
    }

    // Inherit and check member storage qualifiers WRT to the block-level qualifier.
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.storage != EvqTemporary && memberQualifier.storage != EvqGlobal && memberQualifier.storage != currentBlockQualifier.storage)
            error(memberLoc, "member storage qualifier cannot contradict block storage qualifier", memberType.getFieldName().c_str(), "");
        memberQualifier.storage = currentBlockQualifier.storage;
        globalQualifierFixCheck(memberLoc, memberQualifier);
        inheritMemoryQualifiers(currentBlockQualifier, memberQualifier);
        if (currentBlockQualifier.perPrimitiveNV)
            memberQualifier.perPrimitiveNV = currentBlockQualifier.perPrimitiveNV;
        if (currentBlockQualifier.perViewNV)
            memberQualifier.perViewNV = currentBlockQualifier.perViewNV;
        if (currentBlockQualifier.perTaskNV)
            memberQualifier.perTaskNV = currentBlockQualifier.perTaskNV;
        if (currentBlockQualifier.storage == EvqtaskPayloadSharedEXT)
            memberQualifier.storage = EvqtaskPayloadSharedEXT;
        if (memberQualifier.storage == EvqSpirvStorageClass)
            error(memberLoc, "member cannot have a spirv_storage_class qualifier", memberType.getFieldName().c_str(), "");
        if (memberQualifier.hasSpirvDecorate() && !memberQualifier.getSpirvDecorate().decorateIds.empty())
            error(memberLoc, "member cannot have a spirv_decorate_id qualifier", memberType.getFieldName().c_str(), "");
        if ((currentBlockQualifier.storage == EvqUniform || currentBlockQualifier.storage == EvqBuffer) && (memberQualifier.isInterpolation() || memberQualifier.isAuxiliary()))
            error(memberLoc, "member of uniform or buffer block cannot have an auxiliary or interpolation qualifier", memberType.getFieldName().c_str(), "");
        if (memberType.isArray())
            arraySizesCheck(memberLoc, currentBlockQualifier, memberType.getArraySizes(), nullptr, member == typeList.size() - 1);
        if (memberQualifier.hasOffset()) {
            if (spvVersion.spv == 0) {
                profileRequires(memberLoc, ~EEsProfile, 440, E_GL_ARB_enhanced_layouts, "\"offset\" on block member");
                profileRequires(memberLoc, EEsProfile, 300, E_GL_ARB_enhanced_layouts, "\"offset\" on block member");
            }
        }

        // For bindless texture, sampler can be declared as uniform/storage block member,
        if (memberType.containsOpaque()) {
            if (memberType.containsSampler() && extensionTurnedOn(E_GL_ARB_bindless_texture))
                updateBindlessQualifier(memberType);
            else
                error(memberLoc, "member of block cannot be or contain a sampler, image, or atomic_uint type", typeList[member].type->getFieldName().c_str(), "");
            }

        if (memberType.containsCoopMat())
            error(memberLoc, "member of block cannot be or contain a cooperative matrix type", typeList[member].type->getFieldName().c_str(), "");

        if (memberType.containsCoopVec())
            error(memberLoc, "member of block cannot be or contain a cooperative vector type", typeList[member].type->getFieldName().c_str(), "");
    }

    // This might be a redeclaration of a built-in block.  If so, redeclareBuiltinBlock() will
    // do all the rest.
    if (! symbolTable.atBuiltInLevel() && builtInName(*blockName)) {
        redeclareBuiltinBlock(loc, typeList, *blockName, instanceName, arraySizes);
        return;
    }

    // Not a redeclaration of a built-in; check that all names are user names.
    reservedErrorCheck(loc, *blockName);
    if (instanceName)
        reservedErrorCheck(loc, *instanceName);
    for (unsigned int member = 0; member < typeList.size(); ++member)
        reservedErrorCheck(typeList[member].loc, typeList[member].type->getFieldName());

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (currentBlockQualifier.storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    case EvqShared:     defaultQualification = globalSharedDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if ((currentBlockQualifier.isPushConstant() && !currentBlockQualifier.hasPacking()) ||
        (currentBlockQualifier.isShaderRecord() && !currentBlockQualifier.hasPacking()))
        currentBlockQualifier.layoutPacking = ElpStd430;

    // Special case for "taskNV in/out", which has a default of std430,
    if (currentBlockQualifier.isTaskMemory() && !currentBlockQualifier.hasPacking())
        currentBlockQualifier.layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, currentBlockQualifier, true);

    // "The align qualifier can only be used on blocks or block members, and only for blocks declared with std140 or std430 layouts."
    if (currentBlockQualifier.hasAlign()) {
        if (defaultQualification.layoutPacking != ElpStd140 &&
            defaultQualification.layoutPacking != ElpStd430 &&
            defaultQualification.layoutPacking != ElpScalar) {
            error(loc, "can only be used with std140, std430, or scalar layout packing", "align", "");
            defaultQualification.layoutAlign = -1;
        }
    }

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    bool memberWithPerViewQualifier = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasPacking())
            error(memberLoc, "member of block cannot have a packing layout qualifier", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.hasLocation()) {
            const char* feature = "location on block member";
            switch (currentBlockQualifier.storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                requireProfile(memberLoc, ECoreProfile | ECompatibilityProfile | EEsProfile, feature);
                profileRequires(memberLoc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
                profileRequires(memberLoc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
                memberWithLocation = true;
                break;
            default:
                error(memberLoc, "can only use in an in/out block", feature, "");
                break;
            }
        } else
            memberWithoutLocation = true;

        // "The offset qualifier can only be used on block members of blocks declared with std140 or std430 layouts."
        // "The align qualifier can only be used on blocks or block members, and only for blocks declared with std140 or std430 layouts."
        if (memberQualifier.hasAlign() || memberQualifier.hasOffset()) {
            if (defaultQualification.layoutPacking != ElpStd140 &&
                defaultQualification.layoutPacking != ElpStd430 &&
                defaultQualification.layoutPacking != ElpScalar)
                error(memberLoc, "can only be used with std140, std430, or scalar layout packing", "offset/align", "");
        }

        if (memberQualifier.isPerView()) {
            memberWithPerViewQualifier = true;
        }

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(memberLoc, newMemberQualification, memberQualifier, false);
        memberQualifier = newMemberQualification;
    }

    layoutMemberLocationArrayCheck(loc, memberWithLocation, arraySizes);

    // Ensure that the block has an XfbBuffer assigned. This is needed
    // because if the block has a XfbOffset assigned, then it is
    // assumed that it has implicitly assigned the current global
    // XfbBuffer, and because it's members need to be assigned a
    // XfbOffset if they lack it.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
       if (!currentBlockQualifier.hasXfbBuffer() && currentBlockQualifier.hasXfbOffset())
          currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
    }

    // Process the members
    fixBlockLocations(loc, currentBlockQualifier, typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(currentBlockQualifier, typeList);
    fixBlockUniformOffsets(currentBlockQualifier, typeList);
    fixBlockUniformLayoutMatrix(currentBlockQualifier, &typeList, nullptr);
    fixBlockUniformLayoutPacking(currentBlockQualifier, &typeList, nullptr);
    for (unsigned int member = 0; member < typeList.size(); ++member)
        layoutTypeCheck(typeList[member].loc, *typeList[member].type);

    if (memberWithPerViewQualifier) {
        for (unsigned int member = 0; member < typeList.size(); ++member) {
            checkAndResizeMeshViewDim(typeList[member].loc, *typeList[member].type, /*isBlockMember*/ true);
        }
    }

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(currentBlockQualifier, defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    TType blockType(&typeList, *blockName, currentBlockQualifier);
    if (arraySizes != nullptr)
        blockType.transferArraySizes(arraySizes);

    if (arraySizes == nullptr)
        ioArrayCheck(loc, blockType, instanceName ? *instanceName : *blockName);
    if (currentBlockQualifier.hasBufferReference()) {

        if (currentBlockQualifier.storage != EvqBuffer)
            error(loc, "can only be used with buffer", "buffer_reference", "");

        // Create the block reference type. If it was forward-declared, detect that
        // as a referent struct type with no members. Replace the referent type with
        // blockType.
        TType blockNameType(EbtReference, blockType, *blockName);
        TVariable* blockNameVar = new TVariable(blockName, blockNameType, true);
        if (! symbolTable.insert(*blockNameVar)) {
            TSymbol* existingName = symbolTable.find(*blockName);
            if (existingName->getType().isReference() &&
                existingName->getType().getReferentType()->getStruct() &&
                existingName->getType().getReferentType()->getStruct()->size() == 0 &&
                existingName->getType().getQualifier().storage == blockType.getQualifier().storage) {
                existingName->getType().getReferentType()->deepCopy(blockType);
            } else {
                error(loc, "block name cannot be redefined", blockName->c_str(), "");
            }
        }
        if (!instanceName) {
            return;
        }
    } else {
        //
        // Don't make a user-defined type out of block name; that will cause an error
        // if the same block name gets reused in a different interface.
        //
        // "Block names have no other use within a shader
        // beyond interface matching; it is a compile-time error to use a block name at global scope for anything
        // other than as a block name (e.g., use of a block name for a global variable name or function name is
        // currently reserved)."
        //
        // Use the symbol table to prevent normal reuse of the block's name, as a variable entry,
        // whose type is EbtBlock, but without all the structure; that will come from the type
        // the instances point to.
        //
        TType blockNameType(EbtBlock, blockType.getQualifier().storage);
        TVariable* blockNameVar = new TVariable(blockName, blockNameType);
        if (! symbolTable.insert(*blockNameVar)) {
            TSymbol* existingName = symbolTable.find(*blockName);
            if (existingName->getType().getBasicType() == EbtBlock) {
                if (existingName->getType().getQualifier().storage == blockType.getQualifier().storage) {
                    error(loc, "Cannot reuse block name within the same interface:", blockName->c_str(), blockType.getStorageQualifierString());
                    return;
                }
            } else {
                error(loc, "block name cannot redefine a non-block name", blockName->c_str(), "");
                return;
            }
        }
    }

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (! instanceName)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope", blockName->c_str(), "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, variable);

    // fix up
    if (isIoResizeArray(blockType)) {
        ioArraySymbolResizeList.push_back(&variable);
        checkIoArraysConsistency(loc, true);
    } else
        fixIoArraySize(loc, variable.getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(variable);
}